

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_synth.cpp
# Opt level: O3

void __thiscall SaveButton::SaveButton(SaveButton *this)

{
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Save raw","");
  ToggleButton::ToggleButton(&this->super_ToggleButton,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  (this->super_ToggleButton).super_Button.super_Widget._vptr_Widget =
       (_func_int **)&PTR__Button_0010e600;
  return;
}

Assistant:

SaveButton() : ToggleButton("Save raw") {}